

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O3

void __thiscall vectorgraphics::TikzPlotter::addPoint(TikzPlotter *this,Point2D *point_2d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer psVar3;
  Style *this_00;
  bool bVar4;
  iterator iVar5;
  ostream *poVar6;
  undefined1 *puVar7;
  long lVar8;
  long *plVar9;
  pointer psVar10;
  long *plVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  StyleMap style_map;
  allocator_type local_1fa;
  allocator_type local_1f9;
  Point2D *local_1f8;
  TikzPlotter *local_1f0;
  key_type local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  string local_1a8;
  string local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  key_type local_108;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [2];
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_48;
  
  local_168._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_168._M_impl.super__Rb_tree_header._M_header;
  local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar10 = (point_2d->super_Primitive).style_ptrs.
            super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (point_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8 = point_2d;
  local_1f0 = this;
  local_168._M_impl.super__Rb_tree_header._M_header._M_right =
       local_168._M_impl.super__Rb_tree_header._M_header._M_left;
  if (psVar10 != psVar3) {
    do {
      this_00 = (psVar10->super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      std::
      vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
      ::vector(&local_48,
               (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
                *)local_1f8);
      bVar4 = Style::conditionFulfilled(this_00,&local_48);
      std::
      vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
      ::~vector(&local_48);
      if (bVar4) {
        Style::applyStyle((psVar10->
                          super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr,(StyleMap *)&local_168);
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar3);
  }
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"draw","");
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&local_168,&local_108);
  p_Var2 = &local_168._M_impl.super__Rb_tree_header;
  bVar4 = true;
  if ((_Rb_tree_header *)iVar5._M_node == p_Var2) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"fill","");
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_168,&local_1e8);
    bVar4 = (_Rb_tree_header *)iVar5._M_node != p_Var2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    puVar7 = &local_1f0->field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar7,"\\path[",6);
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"draw","");
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"draw opacity","");
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"fill","");
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"fill opacity","");
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"line width","");
    plVar9 = local_58;
    local_68[0] = plVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"*point_path","");
    __l._M_len = 6;
    __l._M_array = &local_108;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_120,__l,&local_1f9);
    getStyleMapString(&local_188,(StyleMap *)&local_168,&local_120);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar7,local_188._M_dataplus._M_p,local_188._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    poVar6 = operator<<(poVar6,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"circle [",8);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"radius","");
    plVar11 = local_1b8;
    local_1c8[0] = plVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"*point_circle","");
    __l_00._M_len = 2;
    __l_00._M_array = &local_1e8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_138,__l_00,&local_1fa);
    getStyleMapString(&local_1a8,(StyleMap *)&local_168,&local_138);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"];",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    lVar8 = -0x40;
    do {
      if (plVar11 != (long *)plVar11[-2]) {
        operator_delete((long *)plVar11[-2],*plVar11 + 1);
      }
      plVar11 = plVar11 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_120);
    lVar8 = -0xc0;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -4;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_168);
  return;
}

Assistant:

void TikzPlotter::addPoint(const Point2D &point_2d) {
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : point_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(point_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the point based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "*point_path"})
        << "] " 
        << point_2d 
        << "circle [" 
        << getStyleMapString(style_map, {"radius", "*point_circle"})
        << "];" 
        << std::endl;
    }
  }